

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall kratos::FSM::dot_graph(FSM *this,string *filename)

{
  undefined1 local_230 [8];
  ofstream stream;
  string local_30;
  
  std::ofstream::ofstream(local_230,(string *)filename,_S_out);
  dot_graph_abi_cxx11_(&local_30,this);
  std::operator<<((ostream *)local_230,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::ofstream::close();
  std::ofstream::~ofstream(local_230);
  return;
}

Assistant:

void FSM::dot_graph(const std::string& filename) {
    std::ofstream stream(filename);
    stream << dot_graph();
    stream.close();
}